

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

void av1_encode_frame(AV1_COMP *cpi)

{
  int iVar1;
  _Bool _Var2;
  int iVar3;
  undefined4 *puVar4;
  long in_RDI;
  SkipModeInfo *skip_mode_info;
  int mi_col;
  int mi_row;
  uint8_t *map;
  int last_active_segid;
  int mi_cols;
  int mi_rows;
  AV1EncoderConfig *oxcf;
  RD_COUNTS *rdc;
  FeatureFlags *features;
  CurrentFrame *current_frame;
  AV1_COMMON *cm;
  AV1_COMP *in_stack_00000140;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  RefFrameDistanceInfo *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  
  *(byte *)(in_RDI + 0x3c175) = *(byte *)(in_RDI + 0x426f3) & 1;
  if ((*(char *)(in_RDI + 0x409b8) != '\0') && (*(char *)(in_RDI + 0x409b9) != '\0')) {
    iVar3 = *(int *)(in_RDI + 0x3c194);
    iVar1 = *(int *)(in_RDI + 0x3c198);
    in_stack_ffffffffffffffc4 = *(uint *)(in_RDI + 0x40a5c);
    in_stack_ffffffffffffffb8 = *(int **)(in_RDI + 0x71298);
    for (in_stack_ffffffffffffffb4 = 0; in_stack_ffffffffffffffb4 < iVar3;
        in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
      for (in_stack_ffffffffffffffb0 = 0; in_stack_ffffffffffffffb0 < iVar1;
          in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb0 + 1) {
        in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffc4;
        if ((int)(uint)*(byte *)((long)in_stack_ffffffffffffffb8 + (long)in_stack_ffffffffffffffb0)
            < (int)in_stack_ffffffffffffffc4) {
          in_stack_ffffffffffffffa4 =
               (uint)*(byte *)((long)in_stack_ffffffffffffffb8 + (long)in_stack_ffffffffffffffb0);
        }
        *(char *)((long)in_stack_ffffffffffffffb8 + (long)in_stack_ffffffffffffffb0) =
             (char)in_stack_ffffffffffffffa4;
      }
      in_stack_ffffffffffffffb8 = (int *)((long)in_stack_ffffffffffffffb8 + (long)iVar1);
    }
  }
  av1_setup_frame_buf_refs
            ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  enforce_max_ref_frames
            ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8,
             (uint *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  set_rel_frame_dist((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
  av1_setup_frame_sign_bias
            ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  *(undefined4 *)(in_RDI + 0x3ac70) = 0;
  *(undefined4 *)(in_RDI + 0x9d708) = 0;
  if ((*(int *)(in_RDI + 0x608c0) == 0) && (*(int *)(in_RDI + 0x60cb8) == 0)) {
    if (*(char *)(in_RDI + 0x3bf81) == '\x02') {
      *(undefined1 *)(in_RDI + 0x3bf81) = 0;
    }
    encode_frame_internal(in_stack_00000140);
  }
  else {
    iVar3 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x3bf80));
    if (iVar3 == 0) {
      *(undefined1 *)(in_RDI + 0x3bf81) = 2;
    }
    else {
      *(undefined1 *)(in_RDI + 0x3bf81) = 0;
    }
    *(undefined1 *)(in_RDI + 0x3c179) = 4;
    if (*(int *)(in_RDI + 0x42264) != 0) {
      *(undefined1 *)(in_RDI + 0x3c179) = 0;
    }
    _Var2 = is_switchable_motion_mode_allowed
                      ((_Bool)(*(byte *)(in_RDI + 0x3c171) & 1),
                       (_Bool)(*(byte *)(in_RDI + 0x426e6) & 1));
    *(_Bool *)(in_RDI + 0x3c177) = _Var2;
    *(int *)(in_RDI + 0x3a6f0) = 0;
    *(undefined4 *)(in_RDI + 0x3a6f4) = 0;
    encode_frame_internal(in_stack_00000140);
    if ((*(char *)(in_RDI + 0x3bf81) == '\x02') && (*(int *)(in_RDI + 0x3a6f0) == 0)) {
      *(undefined1 *)(in_RDI + 0x3bf81) = 0;
    }
    puVar4 = (undefined4 *)(in_RDI + 0x3bf94);
    iVar3 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x3bf80));
    if ((iVar3 != 0) || (*(char *)(in_RDI + 0x3bf81) == '\0')) {
      *puVar4 = 0;
      puVar4[1] = 0;
    }
    if ((puVar4[1] != 0) && (*(int *)(in_RDI + 0x3a6f4) == 0)) {
      puVar4[1] = 0;
    }
    if (((*(int *)(in_RDI + 0x42264) == 0) && (*(char *)(in_RDI + 0x3c178) == '\x02')) &&
       (*(int *)(in_RDI + 0x3a648) == 0)) {
      *(undefined1 *)(in_RDI + 0x3c178) = 1;
    }
  }
  return;
}

Assistant:

void av1_encode_frame(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  CurrentFrame *const current_frame = &cm->current_frame;
  FeatureFlags *const features = &cm->features;
  RD_COUNTS *const rdc = &cpi->td.rd_counts;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  // Indicates whether or not to use a default reduced set for ext-tx
  // rather than the potential full set of 16 transforms
  features->reduced_tx_set_used = oxcf->txfm_cfg.reduced_tx_type_set;

  // Make sure segment_id is no larger than last_active_segid.
  if (cm->seg.enabled && cm->seg.update_map) {
    const int mi_rows = cm->mi_params.mi_rows;
    const int mi_cols = cm->mi_params.mi_cols;
    const int last_active_segid = cm->seg.last_active_segid;
    uint8_t *map = cpi->enc_seg.map;
    for (int mi_row = 0; mi_row < mi_rows; ++mi_row) {
      for (int mi_col = 0; mi_col < mi_cols; ++mi_col) {
        map[mi_col] = AOMMIN(map[mi_col], last_active_segid);
      }
      map += mi_cols;
    }
  }

  av1_setup_frame_buf_refs(cm);
  enforce_max_ref_frames(cpi, &cpi->ref_frame_flags,
                         cm->cur_frame->ref_display_order_hint,
                         cm->current_frame.display_order_hint);
  set_rel_frame_dist(&cpi->common, &cpi->ref_frame_dist_info,
                     cpi->ref_frame_flags);
  av1_setup_frame_sign_bias(cm);

  // If global motion is enabled, then every buffer which is used as either
  // a source or a ref frame should have an image pyramid allocated.
  // Check here so that issues can be caught early in debug mode
#if !defined(NDEBUG) && !CONFIG_REALTIME_ONLY
  if (cpi->alloc_pyramid) {
    assert(cpi->source->y_pyramid);
    for (int ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
      const RefCntBuffer *const buf = get_ref_frame_buf(cm, ref_frame);
      if (buf != NULL) {
        assert(buf->buf.y_pyramid);
      }
    }
  }
#endif  // !defined(NDEBUG) && !CONFIG_REALTIME_ONLY

#if CONFIG_MISMATCH_DEBUG
  mismatch_reset_frame(av1_num_planes(cm));
#endif

  rdc->newmv_or_intra_blocks = 0;
  cpi->palette_pixel_num = 0;

  if (cpi->sf.hl_sf.frame_parameter_update ||
      cpi->sf.rt_sf.use_comp_ref_nonrd) {
    if (frame_is_intra_only(cm))
      current_frame->reference_mode = SINGLE_REFERENCE;
    else
      current_frame->reference_mode = REFERENCE_MODE_SELECT;

    features->interp_filter = SWITCHABLE;
    if (cm->tiles.large_scale) features->interp_filter = EIGHTTAP_REGULAR;

    features->switchable_motion_mode = is_switchable_motion_mode_allowed(
        features->allow_warped_motion, oxcf->motion_mode_cfg.enable_obmc);

    rdc->compound_ref_used_flag = 0;
    rdc->skip_mode_used_flag = 0;

    encode_frame_internal(cpi);

    if (current_frame->reference_mode == REFERENCE_MODE_SELECT) {
      // Use a flag that includes 4x4 blocks
      if (rdc->compound_ref_used_flag == 0) {
        current_frame->reference_mode = SINGLE_REFERENCE;
#if CONFIG_ENTROPY_STATS
        av1_zero(cpi->td.counts->comp_inter);
#endif  // CONFIG_ENTROPY_STATS
      }
    }
    // Re-check on the skip mode status as reference mode may have been
    // changed.
    SkipModeInfo *const skip_mode_info = &current_frame->skip_mode_info;
    if (frame_is_intra_only(cm) ||
        current_frame->reference_mode == SINGLE_REFERENCE) {
      skip_mode_info->skip_mode_allowed = 0;
      skip_mode_info->skip_mode_flag = 0;
    }
    if (skip_mode_info->skip_mode_flag && rdc->skip_mode_used_flag == 0)
      skip_mode_info->skip_mode_flag = 0;

    if (!cm->tiles.large_scale) {
      if (features->tx_mode == TX_MODE_SELECT &&
          cpi->td.mb.txfm_search_info.txb_split_count == 0)
        features->tx_mode = TX_MODE_LARGEST;
    }
  } else {
    // This is needed if real-time speed setting is changed on the fly
    // from one using compound prediction to one using single reference.
    if (current_frame->reference_mode == REFERENCE_MODE_SELECT)
      current_frame->reference_mode = SINGLE_REFERENCE;
    encode_frame_internal(cpi);
  }
}